

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLLoader.cpp
# Opt level: O3

bool __thiscall Assimp::STLImporter::LoadBinaryFile(STLImporter *this)

{
  aiColor4D *paVar1;
  size_t __n;
  aiColor4D **__s;
  float fVar2;
  undefined8 uVar3;
  ushort uVar4;
  undefined4 uVar5;
  aiNode *paVar6;
  undefined4 uVar8;
  aiScene *paVar7;
  uint uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ushort uVar14;
  float fVar15;
  float fVar16;
  STLImporter *pSVar17;
  long lVar18;
  bool bVar19;
  aiMesh **ppaVar20;
  aiMesh *pMesh;
  long lVar21;
  aiVector3D *__s_00;
  aiVector3D *__s_01;
  aiColor4D *paVar22;
  aiNode *this_00;
  aiNode **ppaVar23;
  uint *puVar24;
  ulong uVar25;
  Logger *pLVar26;
  runtime_error *prVar27;
  ushort uVar28;
  uint i;
  ulong uVar29;
  char *pcVar30;
  uint i_1;
  uint uVar31;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  STLImporter *local_50;
  aiColor4D *local_48;
  aiColor4D *local_40;
  size_t local_38;
  
  this->pScene->mNumMeshes = 1;
  ppaVar20 = (aiMesh **)operator_new__(8);
  this->pScene->mMeshes = ppaVar20;
  pMesh = (aiMesh *)operator_new(0x520);
  pMesh->mPrimitiveTypes = 0;
  pMesh->mNumVertices = 0;
  pMesh->mNumFaces = 0;
  memset(&pMesh->mVertices,0,0xcc);
  pMesh->mBones = (aiBone **)0x0;
  pMesh->mMaterialIndex = 0;
  (pMesh->mName).length = 0;
  (pMesh->mName).data[0] = '\0';
  memset((pMesh->mName).data + 1,0x1b,0x3ff);
  pMesh->mNumAnimMeshes = 0;
  pMesh->mAnimMeshes = (aiAnimMesh **)0x0;
  pMesh->mMethod = 0;
  (pMesh->mAABB).mMin.x = 0.0;
  (pMesh->mAABB).mMin.y = 0.0;
  (pMesh->mAABB).mMin.z = 0.0;
  (pMesh->mAABB).mMax.x = 0.0;
  (pMesh->mAABB).mMax.y = 0.0;
  (pMesh->mAABB).mMax.z = 0.0;
  __s = pMesh->mColors;
  memset(__s,0,0xa0);
  *this->pScene->mMeshes = pMesh;
  if (this->fileSize < 0x54) {
    prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"STL: file is too small for the header","");
    std::runtime_error::runtime_error(prVar27,(string *)local_70);
    *(undefined ***)prVar27 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar27,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar30 = this->mBuffer;
  lVar21 = 0;
  do {
    if (pcVar30[lVar21] == 'C') {
      if (pcVar30[lVar21 + 1] == 'O') {
        if (pcVar30[lVar21 + 2] == 'L') {
          if (pcVar30[lVar21 + 3] == 'O') {
            if (pcVar30[lVar21 + 4] == 'R') {
              lVar18 = lVar21 + 6;
              if (pcVar30[lVar21 + 5] == '=') {
                pLVar26 = DefaultLogger::get();
                Logger::info(pLVar26,"STL: Taking code path for Materialise files");
                (this->clrColorDefault).r = (float)(byte)pcVar30[lVar21 + 6] * 0.003921569;
                (this->clrColorDefault).g = (float)(byte)pcVar30[lVar21 + 7] * 0.003921569;
                (this->clrColorDefault).b = (float)(byte)pcVar30[lVar21 + 8] * 0.003921569;
                (this->clrColorDefault).a = (float)(byte)pcVar30[lVar21 + 9] * 0.003921569;
                pcVar30 = this->mBuffer;
                bVar19 = true;
                goto LAB_006109a9;
              }
            }
            else {
              lVar18 = lVar21 + 5;
            }
          }
          else {
            lVar18 = lVar21 + 4;
          }
        }
        else {
          lVar18 = lVar21 + 3;
        }
      }
      else {
        lVar18 = lVar21 + 2;
      }
    }
    else {
      lVar18 = lVar21 + 1;
    }
    lVar21 = lVar18;
  } while (lVar21 < 0x50);
  bVar19 = false;
LAB_006109a9:
  paVar6 = this->pScene->mRootNode;
  (paVar6->mName).length = 0xc;
  builtin_strncpy((paVar6->mName).data,"<STL_BINARY>",0xd);
  uVar31 = *(uint *)(pcVar30 + 0x50);
  pMesh->mNumFaces = uVar31;
  if (this->fileSize < uVar31 * 0x32 + 0x54) {
    prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,"STL: file is too small to hold all facets","");
    std::runtime_error::runtime_error(prVar27,(string *)local_70);
    *(undefined ***)prVar27 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar27,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_50 = this;
  if (uVar31 != 0) {
    pcVar30 = pcVar30 + 0x54;
    uVar9 = uVar31 * 3;
    pMesh->mNumVertices = uVar9;
    uVar25 = (ulong)uVar9 * 0xc;
    __s_00 = (aiVector3D *)operator_new__(uVar25);
    __n = (((ulong)uVar9 * 0xc - 0xc) / 0xc) * 0xc + 0xc;
    uVar29 = 0;
    memset(__s_00,0,__n);
    pMesh->mVertices = __s_00;
    __s_01 = (aiVector3D *)operator_new__(uVar25);
    memset(__s_01,0,__n);
    pMesh->mNormals = __s_01;
    local_48 = &local_50->clrColorDefault;
    do {
      fVar2 = *(float *)(pcVar30 + 8);
      uVar3 = *(undefined8 *)pcVar30;
      __s_01->x = (float)(int)uVar3;
      __s_01->y = (float)(int)((ulong)uVar3 >> 0x20);
      __s_01->z = fVar2;
      uVar5 = __s_01->x;
      uVar8 = __s_01->y;
      __s_01[1].x = (float)uVar5;
      __s_01[1].y = (float)uVar8;
      fVar2 = __s_01->z;
      __s_01[1].z = fVar2;
      __s_01[2].x = (float)uVar5;
      __s_01[2].y = (float)uVar8;
      __s_01[2].z = fVar2;
      fVar2 = *(float *)(pcVar30 + 0x14);
      uVar3 = *(undefined8 *)(pcVar30 + 0xc);
      __s_00->x = (float)(int)uVar3;
      __s_00->y = (float)(int)((ulong)uVar3 >> 0x20);
      __s_00->z = fVar2;
      fVar2 = *(float *)(pcVar30 + 0x20);
      uVar3 = *(undefined8 *)(pcVar30 + 0x18);
      __s_00[1].x = (float)(int)uVar3;
      __s_00[1].y = (float)(int)((ulong)uVar3 >> 0x20);
      __s_00[1].z = fVar2;
      fVar2 = *(float *)(pcVar30 + 0x2c);
      uVar3 = *(undefined8 *)(pcVar30 + 0x24);
      __s_00[2].x = (float)(int)uVar3;
      __s_00[2].y = (float)(int)((ulong)uVar3 >> 0x20);
      __s_00[2].z = fVar2;
      uVar4 = *(ushort *)(pcVar30 + 0x30);
      if ((short)uVar4 < 0) {
        paVar22 = *__s;
        if (paVar22 == (aiColor4D *)0x0) {
          uVar31 = pMesh->mNumVertices;
          local_38 = (ulong)uVar31 << 4;
          paVar22 = (aiColor4D *)operator_new__(local_38);
          if ((ulong)uVar31 == 0) {
            *__s = paVar22;
            uVar25 = 0;
          }
          else {
            uVar31 = 0;
            local_40 = paVar22;
            memset(paVar22,0,local_38);
            *__s = local_40;
            do {
              paVar22 = pMesh->mColors[0];
              pMesh->mColors[0] = paVar22 + 1;
              fVar2 = local_48->g;
              fVar15 = local_48->b;
              fVar16 = local_48->a;
              paVar22->r = local_48->r;
              paVar22->g = fVar2;
              paVar22->b = fVar15;
              paVar22->a = fVar16;
              uVar31 = uVar31 + 1;
              uVar25 = (ulong)pMesh->mNumVertices;
            } while (uVar31 < pMesh->mNumVertices);
            paVar22 = *__s;
          }
          *__s = paVar22 + -uVar25;
          pLVar26 = DefaultLogger::get();
          Logger::info(pLVar26,"STL: Mesh has vertex colors");
          paVar22 = *__s;
        }
        uVar25 = (ulong)(uint)((int)uVar29 * 3);
        uVar28 = uVar4 >> 10;
        uVar14 = uVar4;
        if (!bVar19) {
          uVar28 = uVar4;
          uVar14 = uVar4 >> 10;
        }
        paVar22[uVar25].a = 1.0;
        paVar22[uVar25].r = (float)(uVar14 & 0x31) * 0.032258064;
        paVar22[uVar25].g = (float)(uVar4 >> 5 & 0x31) * 0.032258064;
        paVar22[uVar25].b = (float)(uVar28 & 0x31) * 0.032258064;
        paVar1 = paVar22 + uVar25;
        uVar10 = paVar1->r;
        uVar11 = paVar1->g;
        uVar12 = paVar1->b;
        uVar13 = paVar1->a;
        paVar1 = paVar22 + uVar25 + 1;
        paVar1->r = (float)uVar10;
        paVar1->g = (float)uVar11;
        paVar1->b = (float)uVar12;
        paVar1->a = (float)uVar13;
        paVar22 = paVar22 + uVar25 + 2;
        paVar22->r = (float)uVar10;
        paVar22->g = (float)uVar11;
        paVar22->b = (float)uVar12;
        paVar22->a = (float)uVar13;
        uVar31 = pMesh->mNumFaces;
      }
      __s_01 = __s_01 + 3;
      __s_00 = __s_00 + 3;
      pcVar30 = pcVar30 + 0x32;
      uVar29 = uVar29 + 1;
    } while (uVar29 < uVar31);
    addFacesToMesh(pMesh);
    pSVar17 = local_50;
    paVar6 = local_50->pScene->mRootNode;
    this_00 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_00);
    this_00->mParent = paVar6;
    paVar6->mNumChildren = 1;
    ppaVar23 = (aiNode **)operator_new__(8);
    paVar6->mChildren = ppaVar23;
    *ppaVar23 = this_00;
    paVar7 = pSVar17->pScene;
    uVar31 = paVar7->mNumMeshes;
    this_00->mNumMeshes = uVar31;
    puVar24 = (uint *)operator_new__((ulong)uVar31 << 2);
    this_00->mMeshes = puVar24;
    if (paVar7->mNumMeshes != 0) {
      uVar25 = 0;
      do {
        this_00->mMeshes[uVar25] = (uint)uVar25;
        uVar25 = uVar25 + 1;
      } while (uVar25 < pSVar17->pScene->mNumMeshes);
    }
    if ((bVar19) && (*__s == (aiColor4D *)0x0)) {
      bVar19 = true;
    }
    else {
      bVar19 = false;
    }
    return bVar19;
  }
  prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"STL: file is empty. There are no facets defined","");
  std::runtime_error::runtime_error(prVar27,(string *)local_70);
  *(undefined ***)prVar27 = &PTR__runtime_error_0080bf48;
  __cxa_throw(prVar27,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool STLImporter::LoadBinaryFile()
{
    // allocate one mesh
    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[1];
    aiMesh* pMesh = pScene->mMeshes[0] = new aiMesh();
    pMesh->mMaterialIndex = 0;

    // skip the first 80 bytes
    if (fileSize < 84) {
        throw DeadlyImportError("STL: file is too small for the header");
    }
    bool bIsMaterialise = false;

    // search for an occurrence of "COLOR=" in the header
    const unsigned char* sz2 = (const unsigned char*)mBuffer;
    const unsigned char* const szEnd = sz2+80;
    while (sz2 < szEnd) {

        if ('C' == *sz2++ && 'O' == *sz2++ && 'L' == *sz2++ &&
            'O' == *sz2++ && 'R' == *sz2++ && '=' == *sz2++)    {

            // read the default vertex color for facets
            bIsMaterialise = true;
            ASSIMP_LOG_INFO("STL: Taking code path for Materialise files");
            const ai_real invByte = (ai_real)1.0 / ( ai_real )255.0;
            clrColorDefault.r = (*sz2++) * invByte;
            clrColorDefault.g = (*sz2++) * invByte;
            clrColorDefault.b = (*sz2++) * invByte;
            clrColorDefault.a = (*sz2++) * invByte;
            break;
        }
    }
    const unsigned char* sz = (const unsigned char*)mBuffer + 80;

    // now read the number of facets
    pScene->mRootNode->mName.Set("<STL_BINARY>");

    pMesh->mNumFaces = *((uint32_t*)sz);
    sz += 4;

    if (fileSize < 84 + pMesh->mNumFaces*50) {
        throw DeadlyImportError("STL: file is too small to hold all facets");
    }

    if (!pMesh->mNumFaces) {
        throw DeadlyImportError("STL: file is empty. There are no facets defined");
    }

    pMesh->mNumVertices = pMesh->mNumFaces*3;

    
    aiVector3D *vp = pMesh->mVertices = new aiVector3D[pMesh->mNumVertices];
    aiVector3D *vn = pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];

    typedef aiVector3t<float> aiVector3F;
    aiVector3F* theVec;
    aiVector3F theVec3F;
    
    for ( unsigned int i = 0; i < pMesh->mNumFaces; ++i ) {
        // NOTE: Blender sometimes writes empty normals ... this is not
        // our fault ... the RemoveInvalidData helper step should fix that

        // There's one normal for the face in the STL; use it three times
        // for vertex normals
        theVec = (aiVector3F*) sz;
        ::memcpy( &theVec3F, theVec, sizeof(aiVector3F) );
        vn->x = theVec3F.x; vn->y = theVec3F.y; vn->z = theVec3F.z;
        *(vn+1) = *vn;
        *(vn+2) = *vn;
        ++theVec;
        vn += 3;

        // vertex 1
        ::memcpy( &theVec3F, theVec, sizeof(aiVector3F) );
        vp->x = theVec3F.x; vp->y = theVec3F.y; vp->z = theVec3F.z;
        ++theVec;
        ++vp;

        // vertex 2
        ::memcpy( &theVec3F, theVec, sizeof(aiVector3F) );
        vp->x = theVec3F.x; vp->y = theVec3F.y; vp->z = theVec3F.z;
        ++theVec;
        ++vp;

        // vertex 3
        ::memcpy( &theVec3F, theVec, sizeof(aiVector3F) );
        vp->x = theVec3F.x; vp->y = theVec3F.y; vp->z = theVec3F.z;
        ++theVec;
        ++vp;
        
        sz = (const unsigned char*) theVec;

        uint16_t color = *((uint16_t*)sz);
        sz += 2;

        if (color & (1 << 15))
        {
            // seems we need to take the color
            if (!pMesh->mColors[0])
            {
                pMesh->mColors[0] = new aiColor4D[pMesh->mNumVertices];
                for (unsigned int i = 0; i <pMesh->mNumVertices;++i)
                    *pMesh->mColors[0]++ = this->clrColorDefault;
                pMesh->mColors[0] -= pMesh->mNumVertices;

                ASSIMP_LOG_INFO("STL: Mesh has vertex colors");
            }
            aiColor4D* clr = &pMesh->mColors[0][i*3];
            clr->a = 1.0;
            const ai_real invVal( (ai_real)1.0 / ( ai_real )31.0 );
            if (bIsMaterialise) // this is reversed
            {
                clr->r = (color & 0x31u) *invVal;
                clr->g = ((color & (0x31u<<5))>>5u) *invVal;
                clr->b = ((color & (0x31u<<10))>>10u) *invVal;
            }
            else
            {
                clr->b = (color & 0x31u) *invVal;
                clr->g = ((color & (0x31u<<5))>>5u) *invVal;
                clr->r = ((color & (0x31u<<10))>>10u) *invVal;
            }
            // assign the color to all vertices of the face
            *(clr+1) = *clr;
            *(clr+2) = *clr;
        }
    }

    // now copy faces
    addFacesToMesh(pMesh);

    aiNode* root = pScene->mRootNode;

    // allocate one node
    aiNode* node = new aiNode();
    node->mParent = root;

    root->mNumChildren = 1u;
    root->mChildren = new aiNode*[root->mNumChildren];
    root->mChildren[0] = node;

    // add all created meshes to the single node
    node->mNumMeshes = pScene->mNumMeshes;
    node->mMeshes = new unsigned int[pScene->mNumMeshes];
    for (unsigned int i = 0; i < pScene->mNumMeshes; i++)
        node->mMeshes[i] = i;

    if (bIsMaterialise && !pMesh->mColors[0])
    {
        // use the color as diffuse material color
        return true;
    }
    return false;
}